

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCDSect(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  xmlChar *tmp;
  int local_38;
  int count;
  int l;
  int cur;
  int sl;
  int s;
  int rl;
  int r;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  _size = (xmlChar *)0x0;
  r = 0;
  rl = 100;
  tmp._4_4_ = 0;
  buf = (xmlChar *)ctxt;
  if (ctxt->mlType == XML_TYPE_XML) {
    if (*ctxt->input->cur != '<') {
      return;
    }
    if (ctxt->input->cur[1] != '!') {
      return;
    }
    if (ctxt->input->cur[2] != '[') {
      return;
    }
    if (ctxt->input->cur[3] != 'C') {
      return;
    }
    if (ctxt->input->cur[4] != 'D') {
      return;
    }
    if (ctxt->input->cur[5] != 'A') {
      return;
    }
    if (ctxt->input->cur[6] != 'T') {
      return;
    }
    if (ctxt->input->cur[7] != 'A') {
      return;
    }
    if (ctxt->input->cur[8] != '[') {
      return;
    }
    ctxt->input->cur = ctxt->input->cur + 9;
    ctxt->input->col = ctxt->input->col + 9;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
  }
  else {
    if (*ctxt->input->cur != '<') {
      return;
    }
    if (ctxt->input->cur[1] != '[') {
      return;
    }
    if (ctxt->input->cur[2] != '[') {
      return;
    }
    ctxt->input->cur = ctxt->input->cur + 3;
    ctxt->input->col = ctxt->input->col + 3;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
  }
  buf[0x110] = '\b';
  buf[0x111] = '\0';
  buf[0x112] = '\0';
  buf[0x113] = '\0';
  s = xmlCurrentChar((xmlParserCtxtPtr)buf,&sl);
  if (s < 0x100) {
    if (((s < 9) || (10 < s)) && ((s != 0xd && (s < 0x20)))) {
LAB_00188a43:
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
      buf[0x110] = '\a';
      buf[0x111] = '\0';
      buf[0x112] = '\0';
      buf[0x113] = '\0';
      return;
    }
  }
  else if ((((s < 0x100) || (0xd7ff < s)) && ((s < 0xe000 || (0xfffd < s)))) &&
          ((s < 0x10000 || (0x10ffff < s)))) goto LAB_00188a43;
  if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
    *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
    *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
  }
  else {
    *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
  }
  *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)sl;
  cur = xmlCurrentChar((xmlParserCtxtPtr)buf,&l);
  if (cur < 0x100) {
    if (((8 < cur) && (cur < 0xb)) || ((cur == 0xd || (0x1f < cur)))) {
LAB_00188b65:
      if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
        *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
        *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
      }
      else {
        *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
      }
      *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)l;
      count = xmlCurrentChar((xmlParserCtxtPtr)buf,&local_38);
      _size = (xmlChar *)(*xmlMallocAtomic)((long)rl);
      if (_size == (xmlChar *)0x0) {
        xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
        return;
      }
      do {
        if (count < 0x100) {
          if (((8 < count) && (count < 0xb)) || ((count == 0xd || (bVar3 = false, 0x1f < count)))) {
LAB_00188c7b:
            bVar3 = true;
            if ((s == 0x5d) && (bVar3 = true, cur == 0x5d)) {
              bVar3 = count != 0x3e;
            }
          }
        }
        else if ((((0xff < count) && (count < 0xd800)) || ((0xdfff < count && (count < 0xfffe)))) ||
                ((bVar3 = false, 0xffff < count && (bVar3 = false, count < 0x110000))))
        goto LAB_00188c7b;
        if (!bVar3) {
          _size[r] = '\0';
          buf[0x110] = '\a';
          buf[0x111] = '\0';
          buf[0x112] = '\0';
          buf[0x113] = '\0';
          if (count != 0x3e) {
            xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_CDATA_NOT_FINISHED,
                              "CData section not finished\n%.50s\n",_size);
            (*xmlFree)(_size);
            return;
          }
          if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
            *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
            *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
          }
          else {
            *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
          }
          *(long *)(*(long *)(buf + 0x38) + 0x20) =
               *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)local_38;
          if ((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) {
            if (*(long *)(*(long *)buf + 200) == 0) {
              if (*(long *)(*(long *)buf + 0x88) != 0) {
                (**(code **)(*(long *)buf + 0x88))(*(undefined8 *)(buf + 8),_size,r);
              }
            }
            else {
              (**(code **)(*(long *)buf + 200))(*(undefined8 *)(buf + 8),_size,r);
            }
          }
          (*xmlFree)(_size);
          return;
        }
        if (rl <= r + 5) {
          if ((10000000 < rl) && ((*(uint *)(buf + 0x234) & 0x80000) == 0)) {
            xmlFatalErrMsgStr((xmlParserCtxtPtr)buf,XML_ERR_CDATA_NOT_FINISHED,
                              "CData section too big found",(xmlChar *)0x0);
            (*xmlFree)(_size);
            return;
          }
          pxVar2 = (xmlChar *)(*xmlRealloc)(_size,(long)(rl << 1));
          if (pxVar2 == (xmlChar *)0x0) {
            (*xmlFree)(_size);
            xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
            return;
          }
          rl = rl << 1;
          _size = pxVar2;
        }
        if (sl == 1) {
          _size[r] = (xmlChar)s;
          r = r + 1;
        }
        else {
          iVar1 = xmlCopyCharMultiByte(_size + r,s);
          r = iVar1 + r;
        }
        s = cur;
        sl = l;
        cur = count;
        l = local_38;
        tmp._4_4_ = tmp._4_4_ + 1;
        if (0x32 < tmp._4_4_) {
          if ((*(int *)(buf + 0x1c4) == 0) &&
             (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) <
              0xfa)) {
            xmlGROW((xmlParserCtxtPtr)buf);
          }
          if (*(int *)(buf + 0x110) == -1) {
            (*xmlFree)(_size);
            return;
          }
          tmp._4_4_ = 0;
        }
        if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
          *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
          *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
        }
        else {
          *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
        }
        *(long *)(*(long *)(buf + 0x38) + 0x20) =
             *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)local_38;
        count = xmlCurrentChar((xmlParserCtxtPtr)buf,&local_38);
      } while( true );
    }
  }
  else if ((((0xff < cur) && (cur < 0xd800)) || ((0xdfff < cur && (cur < 0xfffe)))) ||
          ((0xffff < cur && (cur < 0x110000)))) goto LAB_00188b65;
  xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
  buf[0x110] = '\a';
  buf[0x111] = '\0';
  buf[0x112] = '\0';
  buf[0x113] = '\0';
  return;
}

Assistant:

void
xmlParseCDSect(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int r, rl;
    int	s, sl;
    int cur, l;
    int count = 0;

    DEBUG_ENTER(("xmlParseCDSect(%s);\n", dbgCtxt(ctxt)));

    /* Check 2.6.0 was NXT(0) not RAW */
    if (ISXML) {						/* XML*/
      if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	  SKIP(9);
      } else
	  RETURN();
    } else {							/* SML */
      if (CMP3(CUR_PTR, '<', '[', '[')) {
	  SKIP(3);
      } else
	  RETURN();
    }

    ctxt->instate = XML_PARSER_CDATA_SECTION;
    r = CUR_CHAR(rl);
    if (!IS_CHAR(r)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
	ctxt->instate = XML_PARSER_CONTENT;
        RETURN();
    }
    NEXTL(rl);
    s = CUR_CHAR(sl);
    if (!IS_CHAR(s)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
	ctxt->instate = XML_PARSER_CONTENT;
        RETURN();
    }
    NEXTL(sl);
    cur = CUR_CHAR(l);
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	RETURN();
    }
    while (IS_CHAR(cur) &&
           ((r != ']') || (s != ']') || (cur != '>'))) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
                             "CData section too big found", NULL);
                xmlFree (buf);
                RETURN();
            }
	    tmp = (xmlChar *) xmlRealloc(buf, size * 2 * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		RETURN();
	    }
	    buf = tmp;
	    size *= 2;
	}
	COPY_BUF(rl,buf,len,r);
	r = s;
	rl = sl;
	s = cur;
	sl = l;
	count++;
	if (count > 50) {
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		RETURN();
            }
	    count = 0;
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
    }
    buf[len] = 0;
    ctxt->instate = XML_PARSER_CONTENT;
    if (cur != '>') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
	                     "CData section not finished\n%.50s\n", buf);
	xmlFree(buf);
        RETURN();
    }
    NEXTL(l);

    /*
     * OK the buffer is to be consumed as cdata.
     */
    if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
	if (ctxt->sax->cdataBlock != NULL)
	    ctxt->sax->cdataBlock(ctxt->userData, buf, len);
	else if (ctxt->sax->characters != NULL)
	    ctxt->sax->characters(ctxt->userData, buf, len);
    }
    xmlFree(buf);
    RETURN_COMMENT(("xmlParseCDSect. ctxt = %s;\n", dbgCtxt(ctxt)));
}